

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

int POOL_tryAdd(POOL_ctx *ctx,POOL_function function,void *opaque)

{
  int iVar1;
  bool bVar2;
  
  if (ctx == (POOL_ctx *)0x0) {
    __assert_fail("ctx != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x1457,"int POOL_tryAdd(POOL_ctx *, POOL_function, void *)");
  }
  pthread_mutex_lock((pthread_mutex_t *)&ctx->queueMutex);
  if (ctx->queueSize < 2) {
    if (ctx->numThreadsBusy != ctx->threadLimit) {
      bVar2 = ctx->queueEmpty == 0;
      goto LAB_0010e776;
    }
  }
  else {
    bVar2 = ctx->queueHead == (ctx->queueTail + 1) % ctx->queueSize;
LAB_0010e776:
    if (!bVar2) {
      POOL_add_internal(ctx,function,opaque);
      iVar1 = 1;
      goto LAB_0010e794;
    }
  }
  iVar1 = 0;
LAB_0010e794:
  pthread_mutex_unlock((pthread_mutex_t *)&ctx->queueMutex);
  return iVar1;
}

Assistant:

int POOL_tryAdd(POOL_ctx* ctx, POOL_function function, void* opaque)
{
    assert(ctx != NULL);
    ZSTD_pthread_mutex_lock(&ctx->queueMutex);
    if (isQueueFull(ctx)) {
        ZSTD_pthread_mutex_unlock(&ctx->queueMutex);
        return 0;
    }
    POOL_add_internal(ctx, function, opaque);
    ZSTD_pthread_mutex_unlock(&ctx->queueMutex);
    return 1;
}